

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_3f792fb::MemPoolAccept::CheckFeeRate
          (MemPoolAccept *this,size_t package_size,CAmount package_fee,TxValidationState *state)

{
  CAmount CVar1;
  bool bVar2;
  CAmount CVar3;
  long *in_R8;
  uint32_t num_bytes;
  long in_FS_OFFSET;
  CAmount mempoolRejectFee;
  CAmount local_88;
  CAmount local_80;
  CAmount local_78;
  string local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = package_fee;
  local_50._M_dataplus._M_p =
       (pointer)CTxMemPool::GetMinFee(this->m_pool,(this->m_pool->m_opts).max_size_bytes);
  num_bytes = (uint32_t)package_size;
  local_80 = CFeeRate::GetFee((CFeeRate *)&local_50,num_bytes);
  CVar1 = local_78;
  if (local_78 < local_80 && 0 < local_80) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"mempool min fee not met","");
    tinyformat::format<long,long>
              (&local_70,(tinyformat *)0x111512a,(char *)&local_78,&local_80,in_R8);
    bVar2 = ValidationState<TxValidationResult>::Invalid
                      (&state->super_ValidationState<TxValidationResult>,TX_RECONSIDERABLE,&local_50
                       ,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00b0b673;
  }
  else {
    CVar3 = CFeeRate::GetFee(&(this->m_pool->m_opts).min_relay_feerate,num_bytes);
    bVar2 = true;
    if (CVar3 <= CVar1) goto LAB_00b0b673;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"min relay fee not met","");
    local_88 = CFeeRate::GetFee(&(this->m_pool->m_opts).min_relay_feerate,num_bytes);
    tinyformat::format<long,long>
              (&local_70,(tinyformat *)0x111512a,(char *)&local_78,&local_88,in_R8);
    bVar2 = ValidationState<TxValidationResult>::Invalid
                      (&state->super_ValidationState<TxValidationResult>,TX_RECONSIDERABLE,&local_50
                       ,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00b0b673;
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_00b0b673:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main, m_pool.cs)
    {
        AssertLockHeld(::cs_main);
        AssertLockHeld(m_pool.cs);
        CAmount mempoolRejectFee = m_pool.GetMinFee().GetFee(package_size);
        if (mempoolRejectFee > 0 && package_fee < mempoolRejectFee) {
            return state.Invalid(TxValidationResult::TX_RECONSIDERABLE, "mempool min fee not met", strprintf("%d < %d", package_fee, mempoolRejectFee));
        }

        if (package_fee < m_pool.m_opts.min_relay_feerate.GetFee(package_size)) {
            return state.Invalid(TxValidationResult::TX_RECONSIDERABLE, "min relay fee not met",
                                 strprintf("%d < %d", package_fee, m_pool.m_opts.min_relay_feerate.GetFee(package_size)));
        }
        return true;
    }